

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O2

uint32_t Assimp::FBX::anon_unknown_3::ReadWord(char *input,char **cursor,char *end)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  allocator<char> local_39;
  string local_38;
  
  puVar2 = (uint32_t *)*cursor;
  if (3 < (ulong)((long)end - (long)puVar2)) {
    uVar1 = *puVar2;
    *cursor = (char *)(puVar2 + 1);
    return uVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"cannot ReadWord, out of bounds",&local_39);
  TokenizeError(&local_38,(long)*cursor - (long)input);
}

Assistant:

uint32_t ReadWord(const char* input, const char*& cursor, const char* end) {
    const size_t k_to_read = sizeof( uint32_t );
    if(Offset(cursor, end) < k_to_read ) {
        TokenizeError("cannot ReadWord, out of bounds",input, cursor);
    }

    uint32_t word;
    ::memcpy(&word, cursor, 4);
    AI_SWAP4(word);

    cursor += k_to_read;

    return word;
}